

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-hash.h
# Opt level: O1

uint64_t mir_hash_strict(void *key,size_t len,uint64_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar6 = seed + len;
  if (0xf < len) {
    auVar2 = vpmovsxdq_avx(ZEXT816(0x288eea2165862b62));
    auVar3 = vpmovzxdq_avx(ZEXT816(0x6831e6a7bdf5ef4d));
    do {
      auVar1 = *key;
      auVar9 = vpsrlq_avx(auVar1,0x20);
      auVar10 = vpmuludq_avx(auVar1,auVar2);
      auVar4 = vpmuludq_avx(auVar9,auVar3);
      auVar10 = vpaddq_avx(auVar10,auVar4);
      auVar4 = vpmuludq_avx(auVar9,auVar2);
      auVar9 = vpsrlq_avx(auVar10,0x20);
      auVar1 = vpmuludq_avx(auVar1,auVar3);
      auVar1 = vpaddq_avx(auVar1,auVar4);
      auVar1 = vpaddq_avx(auVar1,auVar9);
      auVar10 = vpsllq_avx(auVar10,0x20);
      auVar1 = vpaddq_avx(auVar1,auVar10);
      uVar7 = vpextrq_avx(auVar1,1);
      uVar7 = uVar7 ^ auVar1._0_8_ ^ uVar6;
      uVar6 = (uVar7 >> 0x20) * 0xbdf5ef4d + (uVar7 & 0xffffffff) * 0x65862b62;
      uVar6 = (uVar6 << 0x20) +
              (uVar7 & 0xffffffff) * 0xbdf5ef4d + (uVar7 >> 0x20) * 0x65862b62 + (uVar6 >> 0x20) ^
              uVar7;
      len = len - 0x10;
      key = (void *)((long)key + 0x10);
    } while (0xf < len);
  }
  if (7 < len) {
    uVar8 = *(ulong *)*(undefined1 (*) [16])key & 0xffffffff;
    uVar7 = *(ulong *)*(undefined1 (*) [16])key >> 0x20;
    uVar5 = uVar7 * 0xbdf5ef4d + uVar8 * 0x65862b62;
    uVar6 = uVar6 ^ (uVar5 << 0x20) + uVar8 * 0xbdf5ef4d + uVar7 * 0x65862b62 + (uVar5 >> 0x20);
    len = len - 8;
    key = *(undefined1 (*) [16])key + 8;
  }
  if (len != 0) {
    if (len == 8) {
      uVar7 = *(ulong *)*(undefined1 (*) [16])key;
    }
    else {
      if (len < 4) {
        uVar5 = 0;
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)*(uint *)*(undefined1 (*) [16])key << 0x20;
        uVar5 = 4;
      }
      if (uVar5 < len) {
        do {
          uVar7 = uVar7 >> 8 | (ulong)(byte)(*(undefined1 (*) [16])key)[uVar5] << 0x38;
          uVar5 = uVar5 + 1;
        } while (len != uVar5);
      }
    }
    uVar5 = (uVar7 >> 0x20) * 0x6831e6a7 + (uVar7 & 0xffffffff) * 0x288eea21;
    uVar6 = uVar6 ^ (uVar5 << 0x20) +
                    (uVar7 & 0xffffffff) * 0x6831e6a7 + (uVar7 >> 0x20) * 0x288eea21 +
                    (uVar5 >> 0x20);
  }
  uVar7 = (uVar6 >> 0x20) * 0xbdf5ef4d + (uVar6 & 0xffffffff) * 0x65862b62;
  uVar6 = (uVar7 << 0x20) +
          (uVar6 & 0xffffffff) * 0xbdf5ef4d + (uVar6 >> 0x20) * 0x65862b62 + (uVar7 >> 0x20) ^ uVar6
  ;
  uVar7 = (uVar6 >> 0x20) * 0x6831e6a7 + (uVar6 & 0xffffffff) * 0x288eea21;
  return (uVar7 << 0x20) +
         (uVar6 & 0xffffffff) * 0x6831e6a7 + (uVar6 >> 0x20) * 0x288eea21 + (uVar7 >> 0x20) ^ uVar6;
}

Assistant:

static inline uint64_t mir_hash_strict (const void *key, size_t len, uint64_t seed) {
  return mir_hash_1 (key, len, seed, 0);
}